

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 glcts::Blend(Vec4 *rgb,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec4 VVar7;
  
  fVar1 = src->m_data[3];
  fVar4 = dst->m_data[3];
  fVar6 = (1.0 - fVar4) * fVar1;
  fVar5 = fVar1 * fVar4;
  fVar2 = rgb->m_data[2];
  VVar7.m_data[2] = fVar5 + fVar6;
  fVar3 = src->m_data[2];
  fVar4 = (1.0 - fVar1) * fVar4;
  fVar1 = dst->m_data[2];
  VVar7.m_data[0] = fVar4 + VVar7.m_data[2];
  VVar7.m_data[1] = 0.0;
  *in_RDI = CONCAT44(dst->m_data[1] * fVar4 + src->m_data[1] * fVar6 + rgb->m_data[1] * fVar5,
                     dst->m_data[0] * fVar4 + src->m_data[0] * fVar6 + rgb->m_data[0] * fVar5);
  *(float *)(in_RDI + 1) = fVar1 * fVar4 + fVar3 * fVar6 + fVar2 * fVar5;
  *(float *)((long)in_RDI + 0xc) = VVar7.m_data[0];
  VVar7.m_data[3] = 0.0;
  return (Vec4)VVar7.m_data;
}

Assistant:

static tcu::Vec4 Blend(const tcu::Vec4& rgb, const tcu::Vec4& src, const tcu::Vec4& dst)
{
	float	 p[3]   = { GetP0(src, dst), GetP1(src, dst), GetP2(src, dst) };
	float	 alpha  = p[0] + p[1] + p[2];
	tcu::Vec4 rgbOut = (p[0] * rgb) + (p[1] * src) + (p[2] * dst);
	return tcu::Vec4(rgbOut[0], rgbOut[1], rgbOut[2], alpha);
}